

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O2

void __thiscall QCachedPainter::~QCachedPainter(QCachedPainter *this)

{
  finish(this);
  if (this->m_alreadyCached == false) {
    QPixmapCache::insert((QString *)&this->m_pixmapName,(QPixmap *)&this->m_pixmap);
  }
  QPixmap::~QPixmap(&this->m_pixmap);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_pixmapName).d);
  std::unique_ptr<QPainter,_std::default_delete<QPainter>_>::~unique_ptr(&this->m_pixmapPainter);
  return;
}

Assistant:

QCachedPainter::~QCachedPainter()
{
    finish();
    if (!m_alreadyCached)
        QPixmapCache::insert(m_pixmapName, m_pixmap);
}